

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_integrate_pdf<trng::maxwell_dist<float>>(maxwell_dist<float> *d)

{
  float fVar1;
  int i;
  int iVar2;
  result_type_conflict1 rVar3;
  result_type_conflict1 rVar4;
  float fVar5;
  value_type vVar6;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar7;
  result_type tol;
  vector<float,_std::allocator<float>_> y;
  AssertionHandler catchAssertionHandler;
  float local_10c;
  vector<float,_std::allocator<float>_> local_108;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_cc;
  undefined1 local_c8 [16];
  AssertionHandler local_b8;
  SourceLineInfo local_70;
  ITransientExpression local_60;
  float *local_50;
  char *local_48;
  size_t sStack_40;
  float *local_38;
  StringRef local_30;
  
  rVar3 = trng::maxwell_dist<float>::icdf(d,0.01);
  rVar4 = trng::maxwell_dist<float>::icdf(d,0.99);
  local_e8 = (rVar4 - rVar3) / 2896.0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  iVar2 = 0;
  uStack_e4 = extraout_XMM0_Db;
  uStack_e0 = extraout_XMM0_Dc;
  uStack_dc = extraout_XMM0_Dd;
  do {
    fVar5 = (float)iVar2 * local_e8 + rVar3;
    fVar5 = fVar5 * fVar5;
    fVar1 = (d->P).theta_;
    fVar7 = fVar1 * fVar1;
    local_c8 = ZEXT416((uint)(fVar5 * 0.7978846));
    fVar5 = expf(-fVar5 / (fVar7 + fVar7));
    local_b8.m_assertionInfo.macroName.m_start._0_4_ =
         (fVar5 * (float)local_c8._0_4_) / (fVar7 * fVar1);
    if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_b8);
    }
    else {
      *local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_b8.m_assertionInfo.macroName.m_start._0_4_;
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xb51);
  vVar6 = simpson_int<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_10c = 7.631025e-06;
  local_60._vptr_ITransientExpression = (_func_int **)0x2a8487;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  local_70.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_70.line = 0x94;
  Catch::StringRef::StringRef(&local_30,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_60,&local_70,local_30,Normal);
  fVar1 = local_10c;
  local_e8 = ABS(local_e8 * vVar6 + -0.98);
  uStack_e4 = uStack_e4 & 0x7fffffff;
  uStack_e0 = uStack_e0 & 0x7fffffff;
  uStack_dc = uStack_dc & 0x7fffffff;
  local_cc = local_e8;
  Catch::StringRef::StringRef((StringRef *)&local_70,"<");
  local_60.m_result = local_e8 < fVar1;
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0031a2b8;
  local_48 = local_70.file;
  sStack_40 = local_70.line;
  local_50 = &local_cc;
  local_38 = &local_10c;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_60);
  Catch::ITransientExpression::~ITransientExpression(&local_60);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}